

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::backward::NeHelper<false>::Compare<std::__cxx11::string,char[5]>
          (AssertionResult *__return_storage_ptr__,NeHelper<false> *this,char *expr1,char *expr2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1,char (*val2) [5])

{
  char (*val2_local) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val1_local;
  char *expr2_local;
  char *expr1_local;
  
  CmpHelperNE<std::__cxx11::string,char[5]>
            (__return_storage_ptr__,(internal *)this,expr1,expr2,val1,val2);
  return __return_storage_ptr__;
}

Assistant:

static AssertionResult Compare(const char* expr1, const char* expr2, const T1& val1, const T2& val2)
    {
        return CmpHelperNE(expr1, expr2, val1, val2);
    }